

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

Roaring * __thiscall doublechecked::Roaring::operator-=(Roaring *this,Roaring *r)

{
  bool bVar1;
  reference puVar2;
  long in_RSI;
  Roaring *in_RDI;
  uint value;
  iterator __end2;
  iterator __begin2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar3;
  _Self local_28;
  _Self local_20;
  long local_18;
  long local_10;
  
  local_10 = in_RSI;
  roaring::Roaring::operator-=
            ((Roaring *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),&in_RDI->plain
            );
  local_18 = local_10 + 0x28;
  local_20._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  in_RDI);
  local_28._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  in_RDI);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                       ((_Rb_tree_const_iterator<unsigned_int> *)0x111ddc);
    uVar3 = *puVar2;
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::erase
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               CONCAT44(uVar3,in_stack_ffffffffffffffd0),(key_type *)in_RDI);
    std::_Rb_tree_const_iterator<unsigned_int>::operator++
              ((_Rb_tree_const_iterator<unsigned_int> *)CONCAT44(uVar3,in_stack_ffffffffffffffd0));
  }
  return in_RDI;
}

Assistant:

Roaring &operator-=(const Roaring &r) {
        plain -= r.plain;

        for (auto value : r.check)
            check.erase(value);  // Note std::remove() is not for ordered sets

        return *this;
    }